

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O2

void __thiscall soul::AST::Graph::addProcessorInstance(Graph *this,ProcessorInstance *newInstance)

{
  pool_ptr<soul::AST::UnqualifiedName> *this_00;
  pointer ppVar1;
  UnqualifiedName *pUVar2;
  UnqualifiedName *pUVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  pointer ppVar4;
  string local_88;
  CompileMessage local_68;
  
  ppVar4 = (this->processorInstances).
           super__Vector_base<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->processorInstances).
           super__Vector_base<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = &newInstance->instanceName;
  do {
    if (ppVar4 == ppVar1) {
      local_88._M_dataplus._M_p = (pointer)newInstance;
      std::
      vector<soul::pool_ref<soul::AST::ProcessorInstance>,std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>>>
      ::emplace_back<soul::pool_ref<soul::AST::ProcessorInstance>>
                ((vector<soul::pool_ref<soul::AST::ProcessorInstance>,std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>>>
                  *)&this->processorInstances,(pool_ref<soul::AST::ProcessorInstance> *)&local_88);
      return;
    }
    pUVar2 = pool_ptr<soul::AST::UnqualifiedName>::operator*(&ppVar4->object->instanceName);
    pUVar3 = pool_ptr<soul::AST::UnqualifiedName>::operator*(this_00);
    ppVar4 = ppVar4 + 1;
  } while ((pUVar2->identifier).name != (pUVar3->identifier).name);
  pUVar2 = pool_ptr<soul::AST::UnqualifiedName>::operator->(this_00);
  if ((newInstance->implicitInstanceSource).object == (SharedEndpoint *)0x0) {
    pUVar3 = pool_ptr<soul::AST::UnqualifiedName>::operator->(this_00);
    UnqualifiedName::toString_abi_cxx11_(&local_88,pUVar3);
    Errors::nameInUse<std::__cxx11::string>(&local_68,(Errors *)&local_88,args);
  }
  else {
    Errors::cannotReuseImplicitProcessorInstance<>();
  }
  Context::throwError(&(pUVar2->super_Expression).super_Statement.super_ASTObject.context,&local_68,
                      false);
}

Assistant:

void addProcessorInstance (ProcessorInstance& newInstance)
        {
            for (auto& i : processorInstances)
                if (*i->instanceName == *newInstance.instanceName)
                    newInstance.instanceName->context.throwError (newInstance.isImplicitlyCreated()
                                                                    ? Errors::cannotReuseImplicitProcessorInstance()
                                                                    : Errors::nameInUse (newInstance.instanceName->toString()));

            processorInstances.push_back (newInstance);
        }